

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Collision_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Collision_PDU *this)

{
  ostream *poVar1;
  KCHAR8 in_CL;
  KUINT16 Tabs;
  KUINT16 Tabs_00;
  KUINT16 Tabs_01;
  KINT32 Value;
  KStringStream ss;
  KString local_2e0;
  KString local_2c0;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_220,&this->super_Header);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Collision PDU-\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Issuing Entity ID:\n",0x13);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1c0,&this->m_IssuingEntityID);
  UTILS::IndentString(&local_240,&local_1c0,Tabs,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Colliding Entity ID:\n",0x15);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1e0,&this->m_CollidingEntityID);
  UTILS::IndentString(&local_260,&local_1e0,Tabs_00,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Event ID:\n",10);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_200,&this->m_EventID);
  UTILS::IndentString(&local_280,&local_200,Tabs_01,in_CL);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Collision Type: ",0x10);
  DATA_TYPE::ENUMS::GetEnumAsStringCollisionType_abi_cxx11_
            (&local_2a0,(ENUMS *)(ulong)this->m_ui8CollisionType,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nVelocity:     ",0xf);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2c0,&this->m_Velocity);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Mass (KG):      ",0x10);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Mass);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\nLocation (With Respect To Entity): ",0x24);
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_2e0,&this->m_Location);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Collision_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Collision PDU-\n"
       << "Issuing Entity ID:\n"
       << IndentString( m_IssuingEntityID.GetAsString(), 1 )
       << "Colliding Entity ID:\n"
       << IndentString( m_CollidingEntityID.GetAsString(), 1 )
       << "Event ID:\n"
       << IndentString( m_EventID.GetAsString(), 1 )
       << "Collision Type: "                      << GetEnumAsStringCollisionType( m_ui8CollisionType )
       << "\nVelocity:     "                      << m_Velocity.GetAsString()
       << "Mass (KG):      "                      << m_f32Mass
       << "\nLocation (With Respect To Entity): " << m_Location.GetAsString();

    return ss.str();
}